

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_METAL_SETP(Context *ctx)

{
  size_t in_R8;
  char *pcVar1;
  char src0 [64];
  char src1 [64];
  char code [128];
  char local_118 [64];
  char local_d8 [64];
  char local_98 [128];
  
  make_METAL_srcarg_string(ctx,0,(ctx->dest_arg).writemask,local_118,in_R8);
  make_METAL_srcarg_string(ctx,1,(ctx->dest_arg).writemask,local_d8,in_R8);
  if (ctx->instruction_controls < 7) {
    pcVar1 = *(char **)(get_METAL_comparison_string_scalar_comps +
                       (ulong)ctx->instruction_controls * 8);
  }
  else {
    failf(ctx,"%s","unknown comparison control");
    pcVar1 = "";
  }
  make_METAL_destarg_assign(ctx,local_98,0x80,"(%s %s %s)",local_118,pcVar1,local_d8);
  output_line(ctx,"%s",local_98);
  return;
}

Assistant:

static void emit_METAL_SETP(Context *ctx)
{
    const int vecsize = vecsize_from_writemask(ctx->dest_arg.writemask);
    char src0[64]; make_METAL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_METAL_srcarg_string_masked(ctx, 1, src1, sizeof (src1));
    char code[128];

    // destination is always predicate register (which is type bvec4).
    const char *comp = (vecsize == 1) ?
            get_METAL_comparison_string_scalar(ctx) :
            get_METAL_comparison_string_vector(ctx);

    make_METAL_destarg_assign(ctx, code, sizeof (code),
                              "(%s %s %s)", src0, comp, src1);
    output_line(ctx, "%s", code);
}